

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_mffscrni(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 t1;
  uintptr_t o;
  
  if ((ctx->insns_flags2 & 0x80000) == 0) {
    return;
  }
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    t1 = tcg_const_i64_ppc64(tcg_ctx,(ulong)(ctx->opcode >> 0xb & 3));
    gen_helper_mffscrn(ctx,t1);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(t1 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mffscrni(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t1 = tcg_const_i64(tcg_ctx, (uint64_t)RM(ctx->opcode));

    gen_helper_mffscrn(ctx, t1);

    tcg_temp_free_i64(tcg_ctx, t1);
}